

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall
CodeGenGenericContext::MemKillDeadStore(CodeGenGenericContext *this,x86Argument *address)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = MemIntersectFind(this,address);
  if (uVar2 != 0) {
    uVar2 = uVar2 - 1;
    if (this->memCache[uVar2].read == false) {
      this->memCache[uVar2].address.type = argNone;
      this->memCache[uVar2].value.type = argNone;
      uVar1 = this->memCacheFreeSlotCount;
      if (0xf < (ulong)uVar1) {
        __assert_fail("memCacheFreeSlotCount < memoryStateSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                      ,0x9f,"void CodeGenGenericContext::MemKillDeadStore(const x86Argument &)");
      }
      this->memCacheFreeSlotCount = uVar1 + 1;
      this->memCacheFreeSlots[uVar1] = uVar2;
      uVar2 = this->memCache[uVar2].location;
      if (this->x86Base[uVar2].name != o_none) {
        this->x86Base[uVar2].name = o_none;
        this->optimizationCount = this->optimizationCount + 1;
      }
    }
  }
  return;
}

Assistant:

void CodeGenGenericContext::MemKillDeadStore(const x86Argument &address)
{
	if(unsigned memIndex = MemIntersectFind(address))
	{
		memIndex--;

		if(!memCache[memIndex].read)
		{
			MemCache &entry = memCache[memIndex];

			entry.address.type = x86Argument::argNone;
			entry.value.type = x86Argument::argNone;

			assert(memCacheFreeSlotCount < memoryStateSize);
			memCacheFreeSlots[memCacheFreeSlotCount++] = memIndex;

			// Remove dead store
			x86Instruction *curr = memCache[memIndex].location + x86Base;

			if(curr->name != o_none)
			{
				curr->name = o_none;
				optimizationCount++;
			}
		}
	}
}